

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.cpp
# Opt level: O2

void dg::pta::PointerGraph::initStaticNodes(void)

{
  Pointer local_28;
  
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)(NULLPTR + 0xb0));
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)(UNKNOWN_MEMORY + 0xb0));
  local_28.target = (PSNode *)NULLPTR;
  local_28.offset.offset = 0;
  PointerIdPointsToSet::add((PointerIdPointsToSet *)(NULLPTR + 0xb0),&local_28);
  local_28.target = (PSNode *)UNKNOWN_MEMORY;
  local_28.offset.offset = Offset::UNKNOWN;
  PointerIdPointsToSet::add((PointerIdPointsToSet *)(UNKNOWN_MEMORY + 0xb0),&local_28);
  return;
}

Assistant:

void PointerGraph::initStaticNodes() {
    NULLPTR->pointsTo.clear();
    UNKNOWN_MEMORY->pointsTo.clear();
    NULLPTR->pointsTo.add(Pointer(NULLPTR, 0));
    UNKNOWN_MEMORY->pointsTo.add(Pointer(UNKNOWN_MEMORY, Offset::UNKNOWN));
}